

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8.h
# Opt level: O0

void ncnn::conv1x1s2_sgemm_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  __m256 _v;
  int j;
  int i;
  float *outptr;
  float *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  Mat *m_1;
  Mat *m;
  int in_stack_fffffffffffffbdc;
  size_t in_stack_fffffffffffffbe0;
  void **ppvVar1;
  undefined8 in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  Option *in_stack_fffffffffffffc48;
  Mat *in_stack_fffffffffffffc50;
  Mat *in_stack_fffffffffffffc58;
  Mat *in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined4 local_378;
  long *local_370;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined8 local_350;
  undefined1 (*local_348) [32];
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined4 local_328;
  long local_320;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined8 local_300;
  undefined1 (*local_2f8) [32];
  int local_2f0;
  void *local_2e0;
  int *local_2d8;
  long local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  int local_2b4;
  int local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  long local_2a0;
  int local_298;
  int local_294;
  int local_290;
  undefined4 local_28c;
  long local_288;
  int local_280;
  int local_27c;
  long *local_258;
  void **local_250;
  undefined8 *local_248;
  undefined8 *local_238;
  void **local_228;
  int local_208;
  undefined4 local_204;
  void **local_200;
  undefined8 *local_1e0;
  undefined8 *local_1c0;
  undefined1 local_1b5;
  int local_1b4;
  void **local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined1 local_175;
  int local_174;
  undefined8 *local_168;
  void *local_118;
  undefined1 (*local_108) [32];
  undefined8 local_100;
  Option *pOStack_f8;
  Mat *pMStack_f0;
  Mat *pMStack_e8;
  undefined1 (*local_c8) [32];
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  undefined1 (*local_a8) [32];
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  long *local_88;
  undefined4 local_7c;
  long local_78;
  undefined1 (*local_70) [32];
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_27c = *(int *)((long)in_RDI + 0x2c);
  local_280 = (int)in_RDI[7];
  local_288 = in_RDI[2];
  local_28c = (undefined4)in_RDI[3];
  local_290 = *(int *)(in_RSI + 0x2c);
  local_294 = *(int *)(in_RSI + 0x30);
  local_298 = (local_27c * 2 + local_290 * -2) * 8;
  local_250 = &local_2e0;
  local_2e0 = (void *)0x0;
  local_2d8 = (int *)0x0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_2c0 = (long *)0x0;
  local_2b8 = 0;
  local_2b4 = 0;
  local_2b0 = 0;
  local_2ac = 0;
  local_2a8 = 0;
  local_2a0 = 0;
  local_258 = in_RDI;
  Mat::create(in_stack_fffffffffffffbf8,(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20),
              (int)in_stack_fffffffffffffbf0,(int)((ulong)in_stack_fffffffffffffbe8 >> 0x20),
              in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,
              (Allocator *)in_stack_fffffffffffffc58);
  for (local_2f0 = 0; local_2f0 < local_280; local_2f0 = local_2f0 + 1) {
    local_168 = &local_340;
    local_94 = *(int *)((long)local_258 + 0x2c);
    local_98 = (int)local_258[6];
    local_9c = *(undefined4 *)((long)local_258 + 0x34);
    local_a8 = (undefined1 (*) [32])(*local_258 + local_258[8] * (long)local_2f0 * local_258[2]);
    local_b0 = local_258[2];
    local_b4 = (undefined4)local_258[3];
    local_c0 = local_258[4];
    local_90 = &local_340;
    local_38 = (long)local_94 * (long)local_98 * local_b0;
    local_180 = &local_340;
    local_248 = &local_340;
    local_1a8 = &local_390;
    local_1b0 = &local_2e0;
    local_70 = (undefined1 (*) [32])((long)local_2e0 + local_2a0 * local_2f0 * local_2d0);
    local_58 = &local_390;
    local_48 = (long)local_2b4 * (long)local_2b0 * local_2d0;
    local_188 = &local_390;
    local_238 = &local_390;
    local_308 = 0;
    local_30c = 0;
    local_310 = 0;
    local_314 = 0;
    local_328 = 0;
    local_330 = 0;
    local_338 = 0;
    local_340 = 0;
    local_370 = local_2c0;
    local_3c = 0x10;
    local_4c = 0x10;
    local_5c = local_2b4;
    local_60 = local_2b0;
    local_64 = local_2ac;
    local_78 = local_2d0;
    local_7c = local_2c8;
    local_88 = local_2c0;
    local_174 = local_2f0;
    local_175 = 1;
    local_1b4 = local_2f0;
    local_1b5 = 1;
    local_300 = 0;
    local_318 = 0;
    local_390 = 0;
    local_380 = 0;
    local_378 = 0;
    local_368 = 0;
    local_364 = 0;
    local_360 = 0;
    local_35c = 0;
    local_358 = 0;
    local_350 = 0;
    local_388 = 0;
    local_348 = local_70;
    local_2f8 = local_a8;
    for (in_stack_fffffffffffffc6c = 0; in_stack_fffffffffffffc6c < local_294;
        in_stack_fffffffffffffc6c = in_stack_fffffffffffffc6c + 1) {
      for (in_stack_fffffffffffffc68 = 0; in_stack_fffffffffffffc68 < local_290;
          in_stack_fffffffffffffc68 = in_stack_fffffffffffffc68 + 1) {
        local_108 = local_2f8;
        local_100 = *(undefined8 *)*local_2f8;
        in_stack_fffffffffffffc48 = *(Option **)(*local_2f8 + 8);
        in_stack_fffffffffffffc50 = *(Mat **)(*local_2f8 + 0x10);
        in_stack_fffffffffffffc58 = *(Mat **)(*local_2f8 + 0x18);
        local_c8 = local_348;
        *local_348 = *local_2f8;
        local_2f8 = local_2f8 + 2;
        local_348 = local_348 + 1;
        pOStack_f8 = in_stack_fffffffffffffc48;
        pMStack_f0 = in_stack_fffffffffffffc50;
        pMStack_e8 = in_stack_fffffffffffffc58;
      }
      local_2f8 = (undefined1 (*) [32])(*local_2f8 + (long)local_298 * 4);
    }
    local_1e0 = local_238;
    local_1c0 = local_248;
    local_320 = local_c0;
  }
  conv1x1s1_sgemm_pack8_avx
            ((Mat *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
             in_stack_fffffffffffffc48);
  ppvVar1 = &local_2e0;
  if (local_2d8 != (int *)0x0) {
    local_204 = 0xffffffff;
    LOCK();
    local_208 = *local_2d8;
    *local_2d8 = *local_2d8 + -1;
    UNLOCK();
    if (local_208 == 1) {
      local_228 = ppvVar1;
      local_200 = ppvVar1;
      if (local_2c0 == (long *)0x0) {
        local_118 = local_2e0;
        if (local_2e0 != (void *)0x0) {
          free(local_2e0);
        }
      }
      else {
        (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 8;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m256 _v = _mm256_loadu_ps(r0);
                _mm256_storeu_ps(outptr, _v);

                r0 += 16;
                outptr += 8;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack8_avx(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}